

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_abs_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 a)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_sari_i64_arm(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),a,0x3f);
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_xor_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)&tcg_ctx->pool_cur);
  pTVar1->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)ts;
  tcg_gen_sub_i64(tcg_ctx,ret,ret,(TCGv_i64)((long)ts - (long)tcg_ctx));
  tcg_temp_free_internal_arm(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_abs_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 a)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_sari_i64(tcg_ctx, t, a, 63);
    tcg_gen_xor_i64(tcg_ctx, ret, a, t);
    tcg_gen_sub_i64(tcg_ctx, ret, ret, t);
    tcg_temp_free_i64(tcg_ctx, t);
}